

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  TValue *pTVar1;
  bool bVar2;
  int32_t iVar3;
  ulong *puVar4;
  bool bVar5;
  uint uVar6;
  global_State *g;
  uint **ppuVar7;
  int narg;
  long lVar8;
  ulong uVar9;
  uint *local_58 [2];
  ulong local_48;
  uint *local_40;
  ulong local_38;
  
  puVar4 = &local_48;
  lVar8 = 0;
  ppuVar7 = local_58;
  bVar5 = true;
  while( true ) {
    uVar6 = (uint)lVar8 | 1;
    pTVar1 = L->base + lVar8;
    if ((L->top <= pTVar1) || ((&L->base->field_2)[lVar8].it != 0xfffffff7)) {
      lj_err_argt(L,uVar6,6);
    }
    uVar9 = (ulong)(pTVar1->u32).lo;
    *puVar4 = uVar9;
    if (*(char *)(uVar9 + 6) != '\0') {
      lj_err_arg(L,uVar6,LJ_ERR_NOLFUNC);
    }
    narg = (uint)lVar8 + 2;
    iVar3 = lj_lib_checkint(L,narg);
    if ((uint)*(byte *)(uVar9 + 7) <= iVar3 - 1U) break;
    *ppuVar7 = (uint *)(uVar9 + (ulong)(iVar3 - 1U) * 4 + 0x14);
    lVar8 = 2;
    puVar4 = &local_38;
    bVar2 = !bVar5;
    ppuVar7 = &local_40;
    bVar5 = false;
    if (bVar2) {
      uVar6 = *local_40;
      *local_58[0] = uVar6;
      if (((((GCobj *)(ulong)uVar6)->gch).marked & 3) != 0) {
        if ((*(byte *)(local_48 + 4) & 4) != 0) {
          g = (global_State *)(ulong)(L->glref).ptr32;
          if ((byte)((g->gc).state - 1) < 2) {
            gc_mark(g,(GCobj *)(ulong)uVar6);
          }
          else {
            *(byte *)(local_48 + 4) = (g->gc).currentwhite & 3 | *(byte *)(local_48 + 4) & 0xf8;
          }
        }
      }
      return 0;
    }
  }
  lj_err_arg(L,narg,LJ_ERR_IDXRNG);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}